

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall iu_Matcher_x_iutest_x_TypedEq_Test::Body(iu_Matcher_x_iutest_x_TypedEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AssertionResult *in_R8;
  int v;
  AssertionResult iutest_ar;
  undefined4 local_3cc;
  detail *local_3c8;
  long local_3b8 [2];
  string local_3a8;
  AssertionResult local_388;
  _func_int **local_360;
  AssertionHelper local_358;
  undefined1 local_328 [16];
  undefined1 local_318 [376];
  undefined1 local_1a0 [392];
  
  local_3cc = 0;
  local_328._0_8_ = &PTR__IMatcher_002403a0;
  local_318._0_4_ = 1;
  local_1a0._0_4_ = 1;
  local_328._8_8_ = local_318;
  iutest::detail::EqMatcher<int>::operator()
            (&local_388,(EqMatcher<int> *)local_328,(int *)local_1a0);
  if (local_388.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_328);
    std::ostream::operator<<(local_318,1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x70));
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3a8,local_3c8,"TypedEq<int>(1)",(char *)&local_388,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,local_3a8._M_dataplus._M_p,(allocator<char> *)local_328);
    local_358.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_358.m_part_result.super_iuCodeMessage.m_line = 0x6a;
    local_358.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8 != (detail *)local_3b8) {
      operator_delete(local_3c8,local_3b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  paVar1 = &local_388.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_388.m_message._M_dataplus._M_p,
                    local_388.m_message.field_2._M_allocated_capacity + 1);
  }
  local_328._0_8_ = &PTR__IMatcher_002403e0;
  local_328._8_8_ = local_318;
  local_318._0_8_ = &local_3cc;
  local_1a0._0_8_ = &local_3cc;
  iutest::detail::EqMatcher<int*>::operator()
            (&local_388,(EqMatcher<int*> *)local_328,(int **)local_1a0);
  if (local_388.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    local_360 = (_func_int **)&local_3cc;
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_328);
    iutest::detail::iuUniversalPrinter<int_*>::Print((int **)&local_360,(iu_ostream *)local_318);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
    std::ios_base::~ios_base((ios_base *)(local_318 + 0x70));
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3a8,local_3c8,"TypedEq<int*>(&v)",(char *)&local_388,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,local_3a8._M_dataplus._M_p,(allocator<char> *)local_328);
    local_358.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_358.m_part_result.super_iuCodeMessage.m_line = 0x6b;
    local_358.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_358,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_358.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_358.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_358.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8 != (detail *)local_3b8) {
      operator_delete(local_3c8,local_3b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_388.m_message._M_dataplus._M_p,
                    local_388.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Matcher, TypedEq)
{
    int v=0;
    IUTEST_EXPECT_THAT(1, TypedEq<int>(1));
    IUTEST_EXPECT_THAT(&v, TypedEq<int*>(&v));
}